

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

NetDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetDeclarationSyntax,slang::syntax::NetDeclarationSyntax_const&>
          (BumpAllocator *this,NetDeclarationSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  NetStrengthSyntax *pNVar4;
  DataTypeSyntax *pDVar5;
  undefined4 uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  NetDeclarationSyntax *pNVar15;
  
  pNVar15 = (NetDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetDeclarationSyntax *)this->endPtr < pNVar15 + 1) {
    pNVar15 = (NetDeclarationSyntax *)allocateSlow(this,0xd0,8);
  }
  else {
    this->head->current = (byte *)(pNVar15 + 1);
  }
  (pNVar15->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar6 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pNVar15->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar15->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar6;
  (pNVar15->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6
  ;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005ade68;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pNVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pNVar15->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pNVar15->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b0da0;
  pNVar15->delay = args->delay;
  TVar11 = (args->netType).kind;
  uVar12 = (args->netType).field_0x2;
  NVar13.raw = (args->netType).numFlags.raw;
  uVar14 = (args->netType).rawLen;
  pIVar3 = (args->netType).info;
  pNVar4 = args->strength;
  TVar7 = (args->expansionHint).kind;
  uVar8 = (args->expansionHint).field_0x2;
  NVar9.raw = (args->expansionHint).numFlags.raw;
  uVar10 = (args->expansionHint).rawLen;
  pDVar5 = (args->type).ptr;
  (pNVar15->expansionHint).info = (args->expansionHint).info;
  (pNVar15->type).ptr = pDVar5;
  pNVar15->strength = pNVar4;
  (pNVar15->expansionHint).kind = TVar7;
  (pNVar15->expansionHint).field_0x2 = uVar8;
  (pNVar15->expansionHint).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar15->expansionHint).rawLen = uVar10;
  (pNVar15->netType).kind = TVar11;
  (pNVar15->netType).field_0x2 = uVar12;
  (pNVar15->netType).numFlags = (NumericTokenFlags)NVar13.raw;
  (pNVar15->netType).rawLen = uVar14;
  (pNVar15->netType).info = pIVar3;
  uVar6 = *(undefined4 *)&(args->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->declarators).super_SyntaxListBase.super_SyntaxNode.parent;
  (pNVar15->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pNVar15->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar6;
  (pNVar15->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pNVar15->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pNVar15->declarators).super_SyntaxListBase.childCount =
       (args->declarators).super_SyntaxListBase.childCount;
  (pNVar15->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b1660;
  sVar2 = (args->declarators).elements._M_extent._M_extent_value;
  (pNVar15->declarators).elements._M_ptr = (args->declarators).elements._M_ptr;
  (pNVar15->declarators).elements._M_extent._M_extent_value = sVar2;
  uVar8 = (args->semi).field_0x2;
  NVar9.raw = (args->semi).numFlags.raw;
  uVar10 = (args->semi).rawLen;
  pIVar3 = (args->semi).info;
  (pNVar15->semi).kind = (args->semi).kind;
  (pNVar15->semi).field_0x2 = uVar8;
  (pNVar15->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pNVar15->semi).rawLen = uVar10;
  (pNVar15->semi).info = pIVar3;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }